

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O2

void __thiscall
CTPNStmObjectBase::CTPNStmObjectBase(CTPNStmObjectBase *this,CTcSymObj *obj_sym,int is_class)

{
  CTPNStmTop::CTPNStmTop(&this->super_CTPNStmTop);
  CTPNObjDef::CTPNObjDef(&this->super_CTPNObjDef);
  (this->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)&PTR___cxa_pure_virtual_0030d0b8;
  (this->super_CTPNObjDef)._vptr_CTPNObjDef = (_func_int **)&PTR_is_inline_object_0030d1e8;
  (this->super_CTPNObjDef).obj_sym_ = obj_sym;
  (this->super_CTPNObjDef).field_0x49 =
       (this->super_CTPNObjDef).field_0x49 & 0xf0 | (byte)is_class & 1;
  return;
}

Assistant:

CTPNStmObjectBase(class CTcSymObj *obj_sym, int is_class)
    {
        /* remember our defining global symbol */
        obj_sym_ = obj_sym;

        /* we're not yet replaced by another object */
        replaced_ = FALSE;

        /* we're not yet modified */
        modified_ = FALSE;

        /* note whether I'm a class or an ordinary object instance */
        is_class_ = is_class;

        /* presume it's not transient */
        transient_ = FALSE;
    }